

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void __thiscall CompilerContext::compile_continue(CompilerContext *this,SyntaxTree *continue_node)

{
  pointer v;
  pointer pLVar1;
  Command *command;
  unreachable_exception *this_00;
  pointer pLVar2;
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l;
  allocator_type local_71;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_70;
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
  local_58;
  
  pLVar2 = (this->loop_stack).
           super__Vector_base<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pLVar2 == (this->loop_stack).
                  super__Vector_base<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      this_00 = (unreachable_exception *)__cxa_allocate_exception(0x10);
      unreachable_exception::unreachable_exception
                (this_00,
                 "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/compiler.cpp(517)."
                );
      __cxa_throw(this_00,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
    }
    v = pLVar2 + -1;
    pLVar1 = pLVar2 + -1;
    pLVar2 = v;
  } while ((pLVar1->continue_label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
           (element_type *)0x0);
  command = std::experimental::optional<const_Command_&>::operator*(&this->commands->goto_);
  eggs::variants::
  variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>::
  variant<std::shared_ptr<Label>&,5ul,std::shared_ptr<Label>>
            ((variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>
              *)&local_58,&v->continue_label);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_58;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector(&local_70,__l,&local_71);
  compile_command(this,command,&local_70,false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector(&local_70);
  eggs::variants::detail::
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
  ::~_storage(&local_58);
  return;
}

Assistant:

void CompilerContext::compile_continue(const SyntaxTree& continue_node)
{
    for(auto it = loop_stack.rbegin(); it != loop_stack.rend(); ++it)
    {
        if(it->continue_label)
        {
            compile_command(*commands.goto_, { it->continue_label });
            return;
        }
    }
    Unreachable();
}